

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeHalt(Vdbe *p)

{
  u8 uVar1;
  ushort uVar2;
  sqlite3 *db;
  VdbeFrame *pVVar3;
  VTable **ppVVar4;
  sqlite3_vtab *pVtab;
  _func_int_sqlite3_vtab_ptr *p_Var5;
  Btree *pBVar6;
  Pager *pPVar7;
  sqlite3_vfs *pVfs;
  long lVar8;
  char *z;
  bool bVar9;
  bool bVar10;
  sqlite3_file *pFile;
  byte bVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  VdbeFrame *pFrame;
  uint uVar16;
  char *pcVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  VdbeFrame *pDel;
  long lVar21;
  uint local_48;
  int res;
  sqlite3_file *pMaster;
  long local_38;
  
  db = p->db;
  if (db->mallocFailed != '\0') {
    p->rc = 7;
  }
  pVVar3 = p->pFrame;
  if (p->pFrame != (VdbeFrame *)0x0) {
    do {
      pFrame = pVVar3;
      pVVar3 = pFrame->pParent;
    } while (pVVar3 != (VdbeFrame *)0x0);
    sqlite3VdbeFrameRestore(pFrame);
    p->pFrame = (VdbeFrame *)0x0;
    p->nFrame = 0;
  }
  closeCursorsInFrame(p);
  if (p->aMem != (Mem *)0x0) {
    releaseMemArray(p->aMem,p->nMem);
  }
  while (pVVar3 = p->pDelFrame, pVVar3 != (VdbeFrame *)0x0) {
    p->pDelFrame = pVVar3->pParent;
    iVar18 = pVVar3->nChildMem;
    for (lVar20 = 0; lVar20 < pVVar3->nChildCsr; lVar20 = lVar20 + 1) {
      sqlite3VdbeFreeCursor(pVVar3->v,(VdbeCursor *)(&pVVar3[1].v)[(long)iVar18 * 7 + lVar20]);
    }
    releaseMemArray((Mem *)(pVVar3 + 1),pVVar3->nChildMem);
    sqlite3VdbeDeleteAuxData(pVVar3->v->db,&pVVar3->pAuxData,-1,0);
    sqlite3DbFree(pVVar3->v->db,pVVar3);
  }
  if (p->pAuxData != (AuxData *)0x0) {
    sqlite3VdbeDeleteAuxData(p->db,&p->pAuxData,-1,0);
  }
  if (p->magic != 0x2df20da3) {
    return 0;
  }
  if (p->pc < 0) goto LAB_00126d93;
  if ((p->field_0xc1 & 1) != 0) {
    sqlite3VdbeEnter(p);
    uVar15 = p->rc;
    bVar10 = false;
    bVar9 = true;
    bVar11 = (byte)uVar15;
    if ((bVar11 < 0xe) && ((0x2680U >> (uVar15 & 0x1f) & 1) != 0)) {
      if (bVar11 != 9 || -1 < (char)*(ushort *)&p->field_0xc0) {
        if (((bVar11 == 0xd) || ((uVar15 & 0xff) == 7)) && ((*(ushort *)&p->field_0xc0 & 0x40) != 0)
           ) {
          iVar18 = 2;
          bVar10 = true;
          bVar9 = false;
        }
        else {
          sqlite3RollbackAll(db,0x204);
          sqlite3CloseSavepoints(db);
          db->autoCommit = '\x01';
          p->nChange = 0;
          uVar15 = p->rc;
          iVar18 = 0;
          bVar10 = true;
          bVar9 = true;
        }
        goto LAB_001266c7;
      }
      bVar9 = true;
      iVar18 = 0;
      bVar10 = true;
    }
    else {
      iVar18 = 0;
LAB_001266c7:
      if (uVar15 == 0) {
        sqlite3VdbeCheckFk(p,0);
      }
    }
    if (((db->nVTrans < 1) || (db->aVTrans != (VTable **)0x0)) &&
       ((db->autoCommit != '\0' && (db->nVdbeWrite == (uint)((p->field_0xc0 & 0x80) == 0))))) {
      if ((p->rc == 0) || (!bVar10 && p->errorAction == '\x03')) {
        iVar12 = sqlite3VdbeCheckFk(p,1);
        if (iVar12 == 0) {
          ppVVar4 = db->aVTrans;
          db->aVTrans = (VTable **)0x0;
          iVar12 = 0;
          for (lVar20 = 0; (iVar12 == 0 && (lVar20 < db->nVTrans)); lVar20 = lVar20 + 1) {
            pVtab = ppVVar4[lVar20]->pVtab;
            iVar12 = 0;
            if ((pVtab != (sqlite3_vtab *)0x0) &&
               (p_Var5 = pVtab->pModule->xSync, p_Var5 != (_func_int_sqlite3_vtab_ptr *)0x0)) {
              iVar12 = (*p_Var5)(pVtab);
              sqlite3VtabImportErrmsg(p,pVtab);
            }
          }
          db->aVTrans = ppVVar4;
          lVar19 = 0;
          lVar20 = 0;
          bVar9 = false;
          iVar13 = 0;
LAB_00126823:
          if (iVar12 == 0) {
            if (lVar20 < db->nDb) goto code_r0x00126835;
            if ((bVar9) && (db->xCommitCallback != (_func_int_void_ptr *)0x0)) {
              iVar14 = (*db->xCommitCallback)(db->pCommitArg);
              iVar12 = 0x213;
              if (iVar14 != 0) goto LAB_00126ca6;
            }
            pPVar7 = db->aDb->pBt->pBt->pPager;
            uVar1 = pPVar7->memDb;
            if (uVar1 == '\0') {
              pcVar17 = pPVar7->zFilename;
            }
            else {
              pcVar17 = "";
            }
            iVar12 = sqlite3Strlen30(pcVar17);
            if ((iVar12 == 0) || (iVar13 < 2)) {
              lVar20 = 8;
              iVar12 = 0;
              for (lVar19 = 0; (iVar12 == 0 && (lVar19 < db->nDb)); lVar19 = lVar19 + 1) {
                pBVar6 = *(Btree **)((long)&db->aDb->zDbSName + lVar20);
                if (pBVar6 == (Btree *)0x0) {
                  iVar12 = 0;
                }
                else {
                  iVar12 = sqlite3BtreeCommitPhaseOne(pBVar6,(char *)0x0);
                }
                lVar20 = lVar20 + 0x20;
              }
              lVar20 = 8;
              lVar19 = 0;
              while (iVar12 == 0) {
                if (db->nDb <= lVar19) goto LAB_00126deb;
                pBVar6 = *(Btree **)((long)&db->aDb->zDbSName + lVar20);
                if (pBVar6 == (Btree *)0x0) {
                  iVar12 = 0;
                }
                else {
                  iVar12 = sqlite3BtreeCommitPhaseTwo(pBVar6,0);
                }
                lVar19 = lVar19 + 1;
                lVar20 = lVar20 + 0x20;
              }
              goto LAB_00126c8a;
            }
            if (uVar1 == '\0') {
              pcVar17 = pPVar7->zFilename;
            }
            else {
              pcVar17 = "";
            }
            pVfs = db->pVfs;
            pMaster = (sqlite3_file *)0x0;
            uVar15 = sqlite3Strlen30(pcVar17);
            pcVar17 = sqlite3MPrintf(db,"%s-mjXXXXXX9XXz",pcVar17);
            if (pcVar17 != (char *)0x0) {
              uVar16 = 0;
              goto LAB_001269f9;
            }
            iVar12 = 7;
          }
          goto LAB_00126c8a;
        }
        iVar12 = 0x313;
        if ((p->field_0xc0 & 0x80) != 0) {
          sqlite3VdbeLeave(p);
          return 1;
        }
        goto LAB_00126ca6;
      }
      goto LAB_00126caa;
    }
    if (!bVar9) goto LAB_00126cc5;
    iVar18 = 1;
    if ((p->rc == 0) || (p->errorAction == '\x03')) {
LAB_00126cca:
      iVar12 = sqlite3VdbeCloseStatement(p,iVar18);
      if (iVar12 == 0) goto LAB_00126d37;
      if (p->rc == 0 || (char)p->rc == '\x13') {
        p->rc = iVar12;
        sqlite3DbFree(db,p->zErrMsg);
        p->zErrMsg = (char *)0x0;
      }
      sqlite3RollbackAll(db,0x204);
      sqlite3CloseSavepoints(db);
    }
    else {
      if (p->errorAction == '\x02') {
        iVar18 = 2;
        goto LAB_00126cca;
      }
      sqlite3RollbackAll(db,0x204);
      sqlite3CloseSavepoints(db);
      iVar18 = 0;
    }
    db->autoCommit = '\x01';
    p->nChange = 0;
    goto LAB_00126d37;
  }
  goto LAB_00126d69;
code_r0x00126835:
  pBVar6 = *(Btree **)((long)&db->aDb->pBt + lVar19);
  iVar12 = 0;
  if ((pBVar6 != (Btree *)0x0) && (pBVar6->inTrans == '\x02')) {
    sqlite3BtreeEnter(pBVar6);
    pPVar7 = pBVar6->pBt->pPager;
    if ((&db->aDb->safety_level)[lVar19] != '\x01') {
      iVar13 = (~(uint)(0x34L >> (pPVar7->journalMode & 0x3f)) & 1) + iVar13;
    }
    iVar12 = sqlite3PagerExclusiveLock(pPVar7);
    sqlite3BtreeLeave(pBVar6);
    bVar9 = true;
  }
  lVar20 = lVar20 + 1;
  lVar19 = lVar19 + 0x20;
  goto LAB_00126823;
code_r0x00126bb8:
  pBVar6 = *(Btree **)((long)&db->aDb->zDbSName + lVar20);
  if (pBVar6 == (Btree *)0x0) {
    iVar12 = 0;
  }
  else {
    iVar12 = sqlite3BtreeCommitPhaseOne(pBVar6,pcVar17);
  }
  lVar19 = lVar19 + 1;
  lVar20 = lVar20 + 0x20;
  goto LAB_00126ba6;
  while( true ) {
    sqlite3_randomness(4,&local_48);
    sqlite3_snprintf(0xd,pcVar17 + uVar15,"-mj%06X9%02X",(ulong)(local_48 >> 8));
    iVar12 = (*pVfs->xAccess)(pVfs,pcVar17,0,&res);
    if ((iVar12 != 0) || (uVar16 = uVar16 + 1, res == 0)) break;
LAB_001269f9:
    if (uVar16 != 0) {
      if (100 < uVar16) {
        sqlite3_log(0xd,"MJ delete: %s",pcVar17);
        (*pVfs->xDelete)(pVfs,pcVar17,0);
        goto LAB_00126aab;
      }
      if (uVar16 == 1) {
        sqlite3_log(0xd,"MJ collide: %s",pcVar17);
      }
    }
  }
  if (iVar12 == 0) {
LAB_00126aab:
    iVar12 = sqlite3OsOpenMalloc(pVfs,pcVar17,&pMaster,0x4016,(int *)0x0);
    pFile = pMaster;
    if (iVar12 == 0) {
      lVar21 = 0;
      lVar20 = 8;
      for (lVar19 = 0; lVar19 < db->nDb; lVar19 = lVar19 + 1) {
        lVar8 = *(long *)((long)&db->aDb->zDbSName + lVar20);
        if (((lVar8 != 0) && (*(char *)(lVar8 + 0x10) == '\x02')) &&
           (z = *(char **)(**(long **)(lVar8 + 8) + 0xd8), z != (char *)0x0)) {
          local_38 = lVar20;
          iVar12 = sqlite3Strlen30(z);
          iVar12 = (*pFile->pMethods->xWrite)(pFile,z,iVar12 + 1,lVar21);
          uVar15 = sqlite3Strlen30(z);
          if (iVar12 != 0) goto LAB_00126c6c;
          lVar21 = lVar21 + (ulong)uVar15 + 1;
          lVar20 = local_38;
        }
        lVar20 = lVar20 + 0x20;
      }
      uVar15 = (*pFile->pMethods->xDeviceCharacteristics)(pFile);
      if (((uVar15 >> 10 & 1) == 0) && (iVar12 = (*pFile->pMethods->xSync)(pFile,2), iVar12 != 0)) {
LAB_00126c6c:
        sqlite3OsCloseFree(pFile);
        (*pVfs->xDelete)(pVfs,pcVar17,0);
      }
      else {
        lVar19 = 0;
        lVar20 = 8;
        iVar12 = 0;
LAB_00126ba6:
        if (iVar12 == 0) {
          if (lVar19 < db->nDb) goto code_r0x00126bb8;
          sqlite3OsCloseFree(pFile);
          iVar12 = (*pVfs->xDelete)(pVfs,pcVar17,1);
          sqlite3DbFree(db,pcVar17);
          if (iVar12 == 0) {
            if (sqlite3Hooks_0 != (code *)0x0) {
              (*sqlite3Hooks_0)();
            }
            lVar20 = 8;
            for (lVar19 = 0; lVar19 < db->nDb; lVar19 = lVar19 + 1) {
              pBVar6 = *(Btree **)((long)&db->aDb->zDbSName + lVar20);
              if (pBVar6 != (Btree *)0x0) {
                sqlite3BtreeCommitPhaseTwo(pBVar6,1);
              }
              lVar20 = lVar20 + 0x20;
            }
            if (sqlite3Hooks_1 != (code *)0x0) {
              (*sqlite3Hooks_1)();
            }
LAB_00126deb:
            sqlite3VtabCommit(db);
            db->nDeferredCons = 0;
            db->nDeferredImmCons = 0;
            db->flags = db->flags & 0xfdfffffd;
            goto LAB_00126cbd;
          }
          goto LAB_00126c8a;
        }
        sqlite3OsCloseFree(pFile);
      }
    }
  }
  sqlite3DbFree(db,pcVar17);
LAB_00126c8a:
  if (iVar12 == 5) {
    if ((p->field_0xc0 & 0x80) != 0) {
      sqlite3VdbeLeave(p);
      return 5;
    }
    iVar12 = 5;
  }
LAB_00126ca6:
  p->rc = iVar12;
LAB_00126caa:
  sqlite3RollbackAll(db,0);
  p->nChange = 0;
LAB_00126cbd:
  db->nStatement = 0;
LAB_00126cc5:
  if (iVar18 != 0) goto LAB_00126cca;
  iVar18 = 0;
LAB_00126d37:
  if ((p->field_0xc0 & 0x10) != 0) {
    iVar12 = 0;
    if (iVar18 != 2) {
      iVar12 = p->nChange;
      db->nTotalChange = db->nTotalChange + iVar12;
    }
    db->nChange = iVar12;
    p->nChange = 0;
  }
  sqlite3VdbeLeave(p);
  if (p->pc < 0) goto LAB_00126d93;
LAB_00126d69:
  db->nVdbeActive = db->nVdbeActive + -1;
  uVar2 = *(ushort *)&p->field_0xc0;
  if (-1 < (char)uVar2) {
    db->nVdbeWrite = db->nVdbeWrite + -1;
    uVar2 = *(ushort *)&p->field_0xc0;
  }
  if ((uVar2 >> 8 & 1) != 0) {
    db->nVdbeRead = db->nVdbeRead + -1;
  }
LAB_00126d93:
  p->magic = 0x319c2973;
  if (db->mallocFailed == '\0') {
    iVar18 = (uint)(p->rc == 5) * 5;
  }
  else {
    p->rc = 7;
    iVar18 = 0;
  }
  return iVar18;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeHalt(Vdbe *p){
  int rc;                         /* Used to store transient return codes */
  sqlite3 *db = p->db;

  /* This function contains the logic that determines if a statement or
  ** transaction will be committed or rolled back as a result of the
  ** execution of this virtual machine. 
  **
  ** If any of the following errors occur:
  **
  **     SQLITE_NOMEM
  **     SQLITE_IOERR
  **     SQLITE_FULL
  **     SQLITE_INTERRUPT
  **
  ** Then the internal cache might have been left in an inconsistent
  ** state.  We need to rollback the statement transaction, if there is
  ** one, or the complete transaction if there is no statement transaction.
  */

  if( db->mallocFailed ){
    p->rc = SQLITE_NOMEM_BKPT;
  }
  closeAllCursors(p);
  if( p->magic!=VDBE_MAGIC_RUN ){
    return SQLITE_OK;
  }
  checkActiveVdbeCnt(db);

  /* No commit or rollback needed if the program never started or if the
  ** SQL statement does not read or write a database file.  */
  if( p->pc>=0 && p->bIsReader ){
    int mrc;   /* Primary error code from p->rc */
    int eStatementOp = 0;
    int isSpecialError;            /* Set to true if a 'special' error */

    /* Lock all btrees used by the statement */
    sqlite3VdbeEnter(p);

    /* Check for one of the special errors */
    mrc = p->rc & 0xff;
    isSpecialError = mrc==SQLITE_NOMEM || mrc==SQLITE_IOERR
                     || mrc==SQLITE_INTERRUPT || mrc==SQLITE_FULL;
    if( isSpecialError ){
      /* If the query was read-only and the error code is SQLITE_INTERRUPT, 
      ** no rollback is necessary. Otherwise, at least a savepoint 
      ** transaction must be rolled back to restore the database to a 
      ** consistent state.
      **
      ** Even if the statement is read-only, it is important to perform
      ** a statement or transaction rollback operation. If the error 
      ** occurred while writing to the journal, sub-journal or database
      ** file as part of an effort to free up cache space (see function
      ** pagerStress() in pager.c), the rollback is required to restore 
      ** the pager to a consistent state.
      */
      if( !p->readOnly || mrc!=SQLITE_INTERRUPT ){
        if( (mrc==SQLITE_NOMEM || mrc==SQLITE_FULL) && p->usesStmtJournal ){
          eStatementOp = SAVEPOINT_ROLLBACK;
        }else{
          /* We are forced to roll back the active transaction. Before doing
          ** so, abort any other statements this handle currently has active.
          */
          sqlite3RollbackAll(db, SQLITE_ABORT_ROLLBACK);
          sqlite3CloseSavepoints(db);
          db->autoCommit = 1;
          p->nChange = 0;
        }
      }
    }

    /* Check for immediate foreign key violations. */
    if( p->rc==SQLITE_OK ){
      sqlite3VdbeCheckFk(p, 0);
    }
  
    /* If the auto-commit flag is set and this is the only active writer 
    ** VM, then we do either a commit or rollback of the current transaction. 
    **
    ** Note: This block also runs if one of the special errors handled 
    ** above has occurred. 
    */
    if( !sqlite3VtabInSync(db) 
     && db->autoCommit 
     && db->nVdbeWrite==(p->readOnly==0) 
    ){
      if( p->rc==SQLITE_OK || (p->errorAction==OE_Fail && !isSpecialError) ){
        rc = sqlite3VdbeCheckFk(p, 1);
        if( rc!=SQLITE_OK ){
          if( NEVER(p->readOnly) ){
            sqlite3VdbeLeave(p);
            return SQLITE_ERROR;
          }
          rc = SQLITE_CONSTRAINT_FOREIGNKEY;
        }else{ 
          /* The auto-commit flag is true, the vdbe program was successful 
          ** or hit an 'OR FAIL' constraint and there are no deferred foreign
          ** key constraints to hold up the transaction. This means a commit 
          ** is required. */
          rc = vdbeCommit(db, p);
        }
        if( rc==SQLITE_BUSY && p->readOnly ){
          sqlite3VdbeLeave(p);
          return SQLITE_BUSY;
        }else if( rc!=SQLITE_OK ){
          p->rc = rc;
          sqlite3RollbackAll(db, SQLITE_OK);
          p->nChange = 0;
        }else{
          db->nDeferredCons = 0;
          db->nDeferredImmCons = 0;
          db->flags &= ~SQLITE_DeferFKs;
          sqlite3CommitInternalChanges(db);
        }
      }else{
        sqlite3RollbackAll(db, SQLITE_OK);
        p->nChange = 0;
      }
      db->nStatement = 0;
    }else if( eStatementOp==0 ){
      if( p->rc==SQLITE_OK || p->errorAction==OE_Fail ){
        eStatementOp = SAVEPOINT_RELEASE;
      }else if( p->errorAction==OE_Abort ){
        eStatementOp = SAVEPOINT_ROLLBACK;
      }else{
        sqlite3RollbackAll(db, SQLITE_ABORT_ROLLBACK);
        sqlite3CloseSavepoints(db);
        db->autoCommit = 1;
        p->nChange = 0;
      }
    }
  
    /* If eStatementOp is non-zero, then a statement transaction needs to
    ** be committed or rolled back. Call sqlite3VdbeCloseStatement() to
    ** do so. If this operation returns an error, and the current statement
    ** error code is SQLITE_OK or SQLITE_CONSTRAINT, then promote the
    ** current statement error code.
    */
    if( eStatementOp ){
      rc = sqlite3VdbeCloseStatement(p, eStatementOp);
      if( rc ){
        if( p->rc==SQLITE_OK || (p->rc&0xff)==SQLITE_CONSTRAINT ){
          p->rc = rc;
          sqlite3DbFree(db, p->zErrMsg);
          p->zErrMsg = 0;
        }
        sqlite3RollbackAll(db, SQLITE_ABORT_ROLLBACK);
        sqlite3CloseSavepoints(db);
        db->autoCommit = 1;
        p->nChange = 0;
      }
    }
  
    /* If this was an INSERT, UPDATE or DELETE and no statement transaction
    ** has been rolled back, update the database connection change-counter. 
    */
    if( p->changeCntOn ){
      if( eStatementOp!=SAVEPOINT_ROLLBACK ){
        sqlite3VdbeSetChanges(db, p->nChange);
      }else{
        sqlite3VdbeSetChanges(db, 0);
      }
      p->nChange = 0;
    }

    /* Release the locks */
    sqlite3VdbeLeave(p);
  }

  /* We have successfully halted and closed the VM.  Record this fact. */
  if( p->pc>=0 ){
    db->nVdbeActive--;
    if( !p->readOnly ) db->nVdbeWrite--;
    if( p->bIsReader ) db->nVdbeRead--;
    assert( db->nVdbeActive>=db->nVdbeRead );
    assert( db->nVdbeRead>=db->nVdbeWrite );
    assert( db->nVdbeWrite>=0 );
  }
  p->magic = VDBE_MAGIC_HALT;
  checkActiveVdbeCnt(db);
  if( db->mallocFailed ){
    p->rc = SQLITE_NOMEM_BKPT;
  }

  /* If the auto-commit flag is set to true, then any locks that were held
  ** by connection db have now been released. Call sqlite3ConnectionUnlocked() 
  ** to invoke any required unlock-notify callbacks.
  */
  if( db->autoCommit ){
    sqlite3ConnectionUnlocked(db);
  }

  assert( db->nVdbeActive>0 || db->autoCommit==0 || db->nStatement==0 );
  return (p->rc==SQLITE_BUSY ? SQLITE_BUSY : SQLITE_OK);
}